

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBufferTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBufferDataStoreQueryCase::iterate
          (TextureBufferDataStoreQueryCase *this)

{
  TestLog *pTVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  allocator<char> local_141;
  GLuint buffer;
  GLuint texture;
  CallLogWrapper gl;
  string local_120;
  string local_100;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  code *local_78;
  GLenum local_70;
  ResultCollector result;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_EXT_texture_buffer");
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_texture_buffer is not supported",
                 "supportsES32 || m_context.getContextInfo().isExtensionSupported(\"GL_EXT_texture_buffer\")"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureBufferTests.cpp"
                 ,0x157);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120," // ERROR: ",(allocator<char> *)&local_100);
  tcu::ResultCollector::ResultCollector(&result,pTVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  gl.m_enableLog = true;
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"NonBuffer",(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Non-buffer",(allocator<char> *)&local_d8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_120,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  glu::CallLogWrapper::glGenTextures(&gl,1,&texture);
  glu::CallLogWrapper::glBindTexture(&gl,0xde1,texture);
  glu::CallLogWrapper::glTexStorage2D(&gl,0xde1,1,0x8058,0x20,0x20);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"Got Error ",(allocator<char> *)&buffer);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_b8,&local_d8,&local_98);
    std::operator+(&local_100,&local_b8,": ");
    std::operator+(&local_120,&local_100,"gen texture");
    tcu::ResultCollector::fail(&result,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&result,&gl,0xde1,0,0x8c2d,0,this->m_type);
  glu::CallLogWrapper::glDeleteTextures(&gl,1,&texture);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Buffer",(allocator<char> *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Texture buffer",(allocator<char> *)&local_d8);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_120,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  glu::CallLogWrapper::glGenTextures(&gl,1,&texture);
  glu::CallLogWrapper::glBindTexture(&gl,0x8c2a,texture);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Got Error ",&local_141);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_b8,&local_d8,&local_98);
    std::operator+(&local_100,&local_b8,": ");
    std::operator+(&local_120,&local_100,"bind texture");
    tcu::ResultCollector::fail(&result,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  glu::CallLogWrapper::glGenBuffers(&gl,1,&buffer);
  glu::CallLogWrapper::glBindBuffer(&gl,0x8c2a,buffer);
  glu::CallLogWrapper::glBufferData(&gl,0x8c2a,0x20,(void *)0x0,0x88e4);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Got Error ",&local_141);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_b8,&local_d8,&local_98);
    std::operator+(&local_100,&local_b8,": ");
    std::operator+(&local_120,&local_100,"bind buf");
    tcu::ResultCollector::fail(&result,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  glu::CallLogWrapper::glTexBuffer(&gl,0x8c2a,0x8236,buffer);
  GVar4 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar4 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Got Error ",&local_141);
    local_78 = glu::getErrorName;
    local_70 = GVar4;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_78);
    std::operator+(&local_b8,&local_d8,&local_98);
    std::operator+(&local_100,&local_b8,": ");
    std::operator+(&local_120,&local_100,"tex buffer");
    tcu::ResultCollector::fail(&result,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  deqp::gls::StateQueryUtil::verifyStateTextureLevelInteger
            (&result,&gl,0x8c2a,0,0x8c2d,buffer,this->m_type);
  glu::CallLogWrapper::glDeleteTextures(&gl,1,&texture);
  glu::CallLogWrapper::glDeleteBuffers(&gl,1,&buffer);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

TextureBufferDataStoreQueryCase::IterateResult TextureBufferDataStoreQueryCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	TCU_CHECK_AND_THROW(NotSupportedError, supportsES32 || m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer"), "GL_EXT_texture_buffer is not supported");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	// non-buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "NonBuffer", "Non-buffer");

		glw::GLuint	texture;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_2D, texture);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "gen texture");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_2D, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, 0, m_type);

		gl.glDeleteTextures(1, &texture);
	}

	// buffer
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Buffer", "Texture buffer");

		glw::GLuint	texture;
		glw::GLuint	buffer;

		gl.glGenTextures(1, &texture);
		gl.glBindTexture(GL_TEXTURE_BUFFER, texture);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind texture");

		gl.glGenBuffers(1, &buffer);
		gl.glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		gl.glBufferData(GL_TEXTURE_BUFFER, 32, DE_NULL, GL_STATIC_DRAW);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "bind buf");

		gl.glTexBuffer(GL_TEXTURE_BUFFER, GL_R32UI, buffer);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "tex buffer");

		verifyStateTextureLevelInteger(result, gl, GL_TEXTURE_BUFFER, 0, GL_TEXTURE_BUFFER_DATA_STORE_BINDING, buffer, m_type);

		gl.glDeleteTextures(1, &texture);
		gl.glDeleteBuffers(1, &buffer);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}